

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error CFF_Load_FD_Select(CFF_FDSelect fdselect,FT_UInt num_glyphs,FT_Stream stream,
                           FT_ULong offset)

{
  FT_Byte FVar1;
  FT_UInt16 FVar2;
  FT_Error FVar3;
  FT_UInt num_ranges;
  FT_Byte format;
  FT_ULong FStack_28;
  FT_Error error;
  FT_ULong offset_local;
  FT_Stream stream_local;
  CFF_FDSelect pCStack_10;
  FT_UInt num_glyphs_local;
  CFF_FDSelect fdselect_local;
  
  FStack_28 = offset;
  offset_local = (FT_ULong)stream;
  stream_local._4_4_ = num_glyphs;
  pCStack_10 = fdselect;
  num_ranges = FT_Stream_Seek(stream,offset);
  if (num_ranges != 0) {
    return num_ranges;
  }
  FVar1 = FT_Stream_ReadByte((FT_Stream)offset_local,(FT_Error *)&num_ranges);
  if (num_ranges != 0) {
    return num_ranges;
  }
  pCStack_10->format = FVar1;
  pCStack_10->cache_count = 0;
  if (FVar1 == '\0') {
    pCStack_10->data_size = stream_local._4_4_;
  }
  else {
    if (FVar1 != '\x03') {
      return 3;
    }
    FVar2 = FT_Stream_ReadUShort((FT_Stream)offset_local,(FT_Error *)&num_ranges);
    if (num_ranges != 0) {
      return num_ranges;
    }
    if (FVar2 == 0) {
      return 3;
    }
    pCStack_10->data_size = (uint)FVar2 * 3 + 2;
  }
  FVar3 = FT_Stream_ExtractFrame
                    ((FT_Stream)offset_local,(ulong)pCStack_10->data_size,&pCStack_10->data);
  return FVar3;
}

Assistant:

static FT_Error
  CFF_Load_FD_Select( CFF_FDSelect  fdselect,
                      FT_UInt       num_glyphs,
                      FT_Stream     stream,
                      FT_ULong      offset )
  {
    FT_Error  error;
    FT_Byte   format;
    FT_UInt   num_ranges;


    /* read format */
    if ( FT_STREAM_SEEK( offset ) || FT_READ_BYTE( format ) )
      goto Exit;

    fdselect->format      = format;
    fdselect->cache_count = 0;   /* clear cache */

    switch ( format )
    {
    case 0:     /* format 0, that's simple */
      fdselect->data_size = num_glyphs;
      goto Load_Data;

    case 3:     /* format 3, a tad more complex */
      if ( FT_READ_USHORT( num_ranges ) )
        goto Exit;

      if ( !num_ranges )
      {
        FT_TRACE0(( "CFF_Load_FD_Select: empty FDSelect array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      fdselect->data_size = num_ranges * 3 + 2;

    Load_Data:
      if ( FT_FRAME_EXTRACT( fdselect->data_size, fdselect->data ) )
        goto Exit;
      break;

    default:    /* hmm... that's wrong */
      error = FT_THROW( Invalid_File_Format );
    }

  Exit:
    return error;
  }